

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities_impl.hpp
# Opt level: O0

string * __thiscall
websocketpp::utility::to_hex_abi_cxx11_
          (string *__return_storage_ptr__,utility *this,uint8_t *input,size_t length)

{
  char *pcVar1;
  uint8_t *local_68;
  size_t i;
  allocator<char> local_49;
  string local_48 [8];
  string hex;
  size_t length_local;
  uint8_t *input_local;
  string *output;
  
  hex.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"0123456789ABCDEF",&local_49);
  std::allocator<char>::~allocator(&local_49);
  for (local_68 = (uint8_t *)0x0; local_68 < input; local_68 = local_68 + 1) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar1);
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  }
  hex.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_48);
  if ((hex.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_hex(uint8_t const * input, size_t length) {
    std::string output;
    std::string hex = "0123456789ABCDEF";

    for (size_t i = 0; i < length; i++) {
        output += hex[(input[i] & 0xF0) >> 4];
        output += hex[input[i] & 0x0F];
        output += " ";
    }

    return output;
}